

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
::doSolve(BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  double dVar1;
  ulong uVar2;
  const_reference pdVar3;
  size_t col;
  ulong uVar4;
  reference rVar5;
  CombinedCost new_accumulated_cost;
  CombinedCost local_40;
  
  if (row < this->num_rows_) {
    this_00 = &this->covered_cols_;
    for (uVar4 = 0; uVar2 = this->num_cols_, uVar4 < uVar2; uVar4 = uVar4 + 1) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar4);
      if ((*rVar5._M_p & rVar5._M_mask) == 0) {
        dVar1 = accumulated_cost->second;
        pdVar3 = boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(this->cost_function_,row,uVar4);
        local_40.second = dVar1 + *pdVar3;
        local_40.first = accumulated_cost->first;
        (this->current_assignment_).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[row] = uVar4;
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar4);
        *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
        doSolve(this,row + 1,&local_40);
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar4);
        *rVar5._M_p = *rVar5._M_p & ~rVar5._M_mask;
      }
    }
    if (uVar2 < this->num_rows_) {
      local_40.first = accumulated_cost->first + 1;
      local_40.second = accumulated_cost->second;
      (this->current_assignment_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[row] = uVar2;
      doSolve(this,row + 1,&local_40);
    }
  }
  else {
    uVar4 = (this->optimal_cost_).first;
    if ((accumulated_cost->first < uVar4) ||
       ((accumulated_cost->first == uVar4 &&
        (dVar1 = (this->optimal_cost_).second,
        accumulated_cost->second <= dVar1 && dVar1 != accumulated_cost->second)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      dVar1 = accumulated_cost->second;
      (this->optimal_cost_).first = accumulated_cost->first;
      (this->optimal_cost_).second = dVar1;
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }